

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall Lowerer::LowerArraySegmentVars(Lowerer *this,Instr *arrayInstr)

{
  HelperCallOpnd *newSrc;
  Opnd *pOVar1;
  Instr *pIVar2;
  HelperCallOpnd *opndHelper;
  Instr *instrPrev;
  Instr *arrayInstr_local;
  Lowerer *this_local;
  
  newSrc = IR::HelperCallOpnd::New(HelperArraySegmentVars,this->m_func);
  pOVar1 = IR::Instr::UnlinkSrc2(arrayInstr);
  pIVar2 = LowererMD::LoadHelperArgument(&this->m_lowererMD,arrayInstr,pOVar1);
  pOVar1 = IR::Instr::UnlinkSrc1(arrayInstr);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,arrayInstr,pOVar1);
  arrayInstr->m_opcode = Call;
  IR::Instr::SetSrc1(arrayInstr,&newSrc->super_Opnd);
  LowererMD::LowerCall(&this->m_lowererMD,arrayInstr,0);
  return pIVar2;
}

Assistant:

IR::Instr *
Lowerer::LowerArraySegmentVars(IR::Instr *arrayInstr)
{
    IR::Instr * instrPrev;
    IR::HelperCallOpnd * opndHelper = IR::HelperCallOpnd::New(IR::HelperArraySegmentVars, m_func);

    instrPrev = m_lowererMD.LoadHelperArgument(arrayInstr, arrayInstr->UnlinkSrc2());
    m_lowererMD.LoadHelperArgument(arrayInstr, arrayInstr->UnlinkSrc1());

    arrayInstr->m_opcode = Js::OpCode::Call;
    arrayInstr->SetSrc1(opndHelper);

    m_lowererMD.LowerCall(arrayInstr, 0);

    return instrPrev;
}